

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NitfIsd.h
# Opt level: O0

void __thiscall csm::Tre::~Tre(Tre *this)

{
  Tre *this_local;
  
  std::__cxx11::string::~string((string *)(this + 0x28));
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Tre() {}